

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_disk_read_complete
          (torrent *this,disk_buffer_holder *buffer,storage_error *se,peer_request *r,
          shared_ptr<libtorrent::aux::torrent::read_piece_struct> *rp)

{
  undefined8 uVar1;
  error_category *peVar2;
  shared_ptr<libtorrent::aux::torrent::read_piece_struct> *psVar3;
  peer_request *ppVar4;
  bool bVar5;
  int iVar6;
  element_type *peVar7;
  char *pcVar8;
  char *__src;
  unsigned_long __n;
  element_type *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_78 [16];
  undefined1 local_68 [28];
  int size;
  shared_ptr<libtorrent::aux::torrent::read_piece_struct> *local_30;
  shared_ptr<libtorrent::aux::torrent::read_piece_struct> *rp_local;
  peer_request *r_local;
  storage_error *se_local;
  disk_buffer_holder *buffer_local;
  torrent *this_local;
  
  local_30 = rp;
  rp_local = (shared_ptr<libtorrent::aux::torrent::read_piece_struct> *)r;
  r_local = (peer_request *)se;
  se_local = (storage_error *)buffer;
  buffer_local = (disk_buffer_holder *)this;
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)rp);
  peVar7->blocks_left = peVar7->blocks_left + -1;
  bVar5 = storage_error::operator_cast_to_bool((storage_error *)r_local);
  if (bVar5) {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)rp);
    ppVar4 = r_local;
    peVar7->fail = true;
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)rp);
    uVar1._0_4_ = ppVar4->piece;
    uVar1._4_4_ = ppVar4->start;
    peVar2 = *(error_category **)&ppVar4->length;
    (peVar7->error).val_ = (undefined4)uVar1;
    (peVar7->error).failed_ = (bool)(char)((ulong)uVar1 >> 0x20);
    *(int3 *)&(peVar7->error).field_0x5 = (int3)((ulong)uVar1 >> 0x28);
    (peVar7->error).cat_ = peVar2;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)(local_68 + 0x18),"read");
    handle_disk_error(this,stack0xffffffffffffffb0,(storage_error *)r_local,(peer_connection *)0x0,
                      none);
  }
  else {
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)rp);
    pcVar8 = boost::shared_array<char>::get(&peVar7->piece_data);
    iVar6 = *(int *)((long)&(rp_local->
                            super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + 4);
    __src = disk_buffer_holder::data(buffer);
    __n = numeric_cast<unsigned_long,int,void>
                    (*(int *)&(rp_local->
                              super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                              )._M_refcount._M_pi);
    memcpy(pcVar8 + iVar6,__src,__n);
  }
  peVar7 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)rp);
  if (peVar7->blocks_left == 0) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    local_68._16_4_ =
         *(undefined4 *)
          &(rp_local->
           super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
    local_68._20_4_ = torrent_info::piece_size(this_00,(piece_index_t)local_68._16_4_);
    peVar7 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)rp);
    if ((peVar7->fail & 1U) == 0) {
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_78);
      psVar3 = rp_local;
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)rp);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar6),(torrent_handle *)local_78,
                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)psVar3,
                 &peVar7->piece_data,(int *)(local_68 + 0x14));
      torrent_handle::~torrent_handle((torrent_handle *)local_78);
    }
    else {
      iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_68);
      psVar3 = rp_local;
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)rp);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
                ((alert_manager *)CONCAT44(extraout_var,iVar6),(torrent_handle *)local_68,
                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)psVar3,
                 &peVar7->error);
      torrent_handle::~torrent_handle((torrent_handle *)local_68);
    }
  }
  return;
}

Assistant:

void torrent::on_disk_read_complete(disk_buffer_holder buffer
		, storage_error const& se
		, peer_request const&  r, std::shared_ptr<read_piece_struct> rp) try
	{
		// hold a reference until this function returns
		TORRENT_ASSERT(is_single_thread());

		--rp->blocks_left;
		if (se)
		{
			rp->fail = true;
			rp->error = se.ec;
			handle_disk_error("read", se);
		}
		else
		{
			std::memcpy(rp->piece_data.get() + r.start, buffer.data(), aux::numeric_cast<std::size_t>(r.length));
		}

		if (rp->blocks_left == 0)
		{
			int size = m_torrent_file->piece_size(r.piece);
			if (rp->fail)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), r.piece, rp->error);
			}
			else
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), r.piece, rp->piece_data, size);
			}
		}
	}
	catch (...) { handle_exception(); }